

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

void jaegertracing::sampling_manager::thrift::swap
               (SamplingStrategyResponse *a,SamplingStrategyResponse *b)

{
  SamplingStrategyResponse *b_local;
  SamplingStrategyResponse *a_local;
  
  std::swap<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
            (&a->strategyType,&b->strategyType);
  swap(&a->probabilisticSampling,&b->probabilisticSampling);
  swap(&a->rateLimitingSampling,&b->rateLimitingSampling);
  swap(&a->operationSampling,&b->operationSampling);
  std::swap<jaegertracing::sampling_manager::thrift::_SamplingStrategyResponse__isset>
            (&a->__isset,&b->__isset);
  return;
}

Assistant:

void swap(SamplingStrategyResponse &a, SamplingStrategyResponse &b) {
  using ::std::swap;
  swap(a.strategyType, b.strategyType);
  swap(a.probabilisticSampling, b.probabilisticSampling);
  swap(a.rateLimitingSampling, b.rateLimitingSampling);
  swap(a.operationSampling, b.operationSampling);
  swap(a.__isset, b.__isset);
}